

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

void basist::decoder_etc_block::get_block_colors5_bounds
               (color32 *pBlock_colors,color32 *base_color5,uint32_t inten_table,uint32_t l,
               uint32_t h)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  
  bVar1 = (base_color5->field_0).field_0.r;
  bVar2 = (base_color5->field_0).field_0.g;
  bVar3 = (base_color5->field_0).field_0.b;
  uVar4 = (uint)(byte)(bVar1 >> 2 | bVar1 * '\b');
  iVar5 = (&g_etc1_inten_tables)[(ulong)inten_table * 4 + (ulong)l];
  iVar8 = iVar5 + uVar4;
  if (iVar8 < 1) {
    iVar8 = 0;
  }
  if (0xfe < iVar8) {
    iVar8 = 0xff;
  }
  uVar6 = (uint)(byte)(bVar2 >> 2 | bVar2 * '\b');
  iVar7 = iVar5 + uVar6;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  if (0xfe < iVar7) {
    iVar7 = 0xff;
  }
  uVar9 = (uint)(byte)(bVar3 >> 2 | bVar3 * '\b');
  iVar5 = iVar5 + uVar9;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  if (0xfe < iVar5) {
    iVar5 = 0xff;
  }
  (pBlock_colors->field_0).field_0.r = (uint8_t)iVar8;
  (pBlock_colors->field_0).field_0.g = (uint8_t)iVar7;
  (pBlock_colors->field_0).field_0.b = (uint8_t)iVar5;
  (pBlock_colors->field_0).field_0.a = 0xff;
  iVar8 = (&g_etc1_inten_tables)[(ulong)inten_table * 4 + (ulong)h];
  iVar5 = uVar4 + iVar8;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  if (0xfe < iVar5) {
    iVar5 = 0xff;
  }
  iVar7 = uVar6 + iVar8;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  if (0xfe < iVar7) {
    iVar7 = 0xff;
  }
  iVar8 = iVar8 + uVar9;
  if (iVar8 < 1) {
    iVar8 = 0;
  }
  if (0xfe < iVar8) {
    iVar8 = 0xff;
  }
  pBlock_colors[1].field_0.field_0.r = (uint8_t)iVar5;
  pBlock_colors[1].field_0.field_0.g = (uint8_t)iVar7;
  pBlock_colors[1].field_0.field_0.b = (uint8_t)iVar8;
  pBlock_colors[1].field_0.field_0.a = 0xff;
  return;
}

Assistant:

static void get_block_colors5_bounds(color32* pBlock_colors, const color32& base_color5, uint32_t inten_table, uint32_t l = 0, uint32_t h = 3)
		{
			color32 b(base_color5);

			b.r = (b.r << 3) | (b.r >> 2);
			b.g = (b.g << 3) | (b.g >> 2);
			b.b = (b.b << 3) | (b.b >> 2);

			const int* pInten_table = g_etc1_inten_tables[inten_table];

			pBlock_colors[0].set(clamp255(b.r + pInten_table[l]), clamp255(b.g + pInten_table[l]), clamp255(b.b + pInten_table[l]), 255);
			pBlock_colors[1].set(clamp255(b.r + pInten_table[h]), clamp255(b.g + pInten_table[h]), clamp255(b.b + pInten_table[h]), 255);
		}